

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_wrapper_dump(char *filename)

{
  ulong uVar1;
  int iVar2;
  FILE *__stream;
  stb_malloc_record *psVar3;
  long lVar4;
  long lVar5;
  
  __stream = fopen(filename,"w");
  if (0 < stb__alloc_size && __stream != (FILE *)0x0) {
    lVar5 = 0x14;
    lVar4 = 0;
    psVar3 = stb__allocations;
    iVar2 = stb__alloc_size;
    do {
      uVar1 = *(ulong *)((long)psVar3 + lVar5 + -0x14);
      if (1 < uVar1) {
        fprintf(__stream,"%p %7d - %4d %s\n",uVar1,(ulong)*(uint *)((long)&psVar3->p + lVar5),
                (ulong)*(uint *)((long)psVar3 + lVar5 + -4),
                *(undefined8 *)((long)psVar3 + lVar5 + -0xc));
        psVar3 = stb__allocations;
        iVar2 = stb__alloc_size;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (lVar4 < iVar2);
  }
  return;
}

Assistant:

void stb_wrapper_dump(char *filename)
{
   int i;
   FILE *f = fopen(filename, "w");
   if (!f) return;
   for (i=0; i < stb__alloc_size; ++i)
      if (stb__allocations[i].p > STB_DEL)
         fprintf(f, "%p %7d - %4d %s\n",
            stb__allocations[i].p   , stb__allocations[i].size,
            stb__allocations[i].line, stb__allocations[i].file);
}